

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_bary4(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *bary)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  REF_STATUS RVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar24;
  undefined1 auVar23 [16];
  double dVar25;
  double dVar26;
  double dVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  REF_DBL volume;
  double local_38;
  double dStack_30;
  
  iVar12 = *nodes;
  if (((-1 < (long)iVar12) && (iVar1 = ref_node->max, iVar12 < iVar1)) &&
     (pRVar5 = ref_node->global, -1 < pRVar5[iVar12])) {
    uVar2 = nodes[1];
    if (((int)uVar2 < iVar1 && -1 < (int)uVar2) && (-1 < pRVar5[uVar2])) {
      uVar3 = nodes[2];
      if (((int)uVar3 < iVar1 && -1 < (int)uVar3) && (-1 < pRVar5[uVar3])) {
        uVar4 = nodes[3];
        if (((int)uVar4 < iVar1 && -1 < (int)uVar4) && (-1 < pRVar5[uVar4])) {
          pRVar6 = ref_node->real;
          uVar11 = (ulong)(uVar2 * 0xf);
          uVar14 = (ulong)(uVar3 * 0xf);
          uVar16 = (ulong)(uVar4 * 0xf);
          dVar18 = pRVar6[uVar11 + 2] - pRVar6[uVar16 + 2];
          dVar26 = pRVar6[uVar16];
          dVar25 = (pRVar6 + uVar16)[1];
          dVar22 = pRVar6[uVar14 + 1] - pRVar6[uVar16 + 1];
          dVar24 = (pRVar6 + uVar14 + 1)[1] - (pRVar6 + uVar16 + 1)[1];
          dVar20 = pRVar6[uVar11] - dVar26;
          dVar21 = (pRVar6 + uVar11)[1] - dVar25;
          dStack_30 = (dVar21 * dVar24 - dVar18 * dVar22) * (*xyz - dVar26);
          uVar15 = (ulong)(uint)(iVar12 * 0xf);
          auVar19._0_8_ =
               (dStack_30 -
               (dVar24 * dVar20 + -(pRVar6[uVar14] - dVar26) * dVar18) * (xyz[1] - dVar25)) +
               (dVar20 * dVar22 - dVar21 * (pRVar6[uVar14] - dVar26)) *
               (xyz[2] - pRVar6[uVar16 + 2]);
          *bary = auVar19._0_8_;
          dVar18 = xyz[2] - pRVar6[uVar16 + 2];
          dVar26 = pRVar6[uVar16];
          dVar25 = (pRVar6 + uVar16)[1];
          dVar21 = pRVar6[uVar14 + 1] - pRVar6[uVar16 + 1];
          dVar22 = (pRVar6 + uVar14 + 1)[1] - (pRVar6 + uVar16 + 1)[1];
          dVar20 = xyz[1] - dVar25;
          dVar18 = ((dVar20 * dVar22 - dVar18 * dVar21) * (pRVar6[uVar15] - dVar26) -
                   (dVar22 * (*xyz - dVar26) + -(pRVar6[uVar14] - dVar26) * dVar18) *
                   (pRVar6[uVar15 + 1] - dVar25)) +
                   ((*xyz - dVar26) * dVar21 - dVar20 * (pRVar6[uVar14] - dVar26)) *
                   (pRVar6[uVar15 + 2] - pRVar6[uVar16 + 2]);
          bary[1] = dVar18;
          dVar20 = pRVar6[uVar11 + 2] - pRVar6[uVar16 + 2];
          dVar26 = pRVar6[uVar16];
          dVar25 = (pRVar6 + uVar16)[1];
          dVar24 = xyz[1] - pRVar6[uVar16 + 1];
          dVar29 = xyz[2] - (pRVar6 + uVar16 + 1)[1];
          dVar21 = pRVar6[uVar11] - dVar26;
          dVar22 = (pRVar6 + uVar11)[1] - dVar25;
          auVar23._0_8_ =
               ((dVar22 * dVar29 - dVar20 * dVar24) * (pRVar6[uVar15] - dVar26) -
               (dVar29 * dVar21 + -(*xyz - dVar26) * dVar20) * (pRVar6[uVar15 + 1] - dVar25)) +
               (dVar21 * dVar24 - dVar22 * (*xyz - dVar26)) *
               (pRVar6[uVar15 + 2] - pRVar6[uVar16 + 2]);
          bary[2] = auVar23._0_8_;
          dVar25 = pRVar6[uVar11 + 2] - xyz[2];
          dVar26 = *xyz;
          dVar22 = pRVar6[uVar14 + 1] - xyz[1];
          dVar24 = (pRVar6 + uVar14 + 1)[1] - xyz[2];
          dVar20 = pRVar6[uVar11] - dVar26;
          dVar21 = (pRVar6 + uVar11)[1] - xyz[1];
          dVar26 = ((dVar21 * dVar24 - dVar25 * dVar22) * (pRVar6[uVar15] - dVar26) -
                   (dVar24 * dVar20 + -(pRVar6[uVar14] - dVar26) * dVar25) *
                   (pRVar6[uVar15 + 1] - xyz[1])) +
                   (dVar20 * dVar22 - dVar21 * (pRVar6[uVar14] - dVar26)) *
                   (pRVar6[uVar15 + 2] - xyz[2]);
          bary[3] = dVar26;
          local_38 = auVar19._0_8_ + dVar18 + auVar23._0_8_ + dVar26;
          auVar27._0_8_ = local_38 * 1e+20;
          auVar27._8_8_ = auVar19._0_8_;
          auVar28._8_8_ = -auVar19._0_8_;
          auVar28._0_8_ = -auVar27._0_8_;
          auVar28 = maxpd(auVar27,auVar28);
          dVar25 = auVar28._0_8_;
          if (auVar28._8_8_ < dVar25) {
            dVar20 = dVar18;
            if (dVar18 <= -dVar18) {
              dVar20 = -dVar18;
            }
            if (dVar20 < dVar25) {
              dVar20 = auVar23._0_8_;
              if (auVar23._0_8_ <= -auVar23._0_8_) {
                dVar20 = -auVar23._0_8_;
              }
              if (dVar20 < dVar25) {
                dVar20 = dVar26;
                if (dVar26 <= -dVar26) {
                  dVar20 = -dVar26;
                }
                if (dVar20 < dVar25) {
                  auVar19._8_8_ = dVar18;
                  auVar7._8_8_ = local_38;
                  auVar7._0_8_ = local_38;
                  auVar28 = divpd(auVar19,auVar7);
                  *(undefined1 (*) [16])bary = auVar28;
                  auVar23._8_8_ = dVar26;
                  auVar8._8_8_ = local_38;
                  auVar8._0_8_ = local_38;
                  auVar28 = divpd(auVar23,auVar8);
                  *(undefined1 (*) [16])(bary + 2) = auVar28;
                  return 0;
                }
              }
            }
          }
          RVar9 = ref_node_tet_vol(ref_node,nodes,&volume);
          if (RVar9 == 0) {
            printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",local_38,*bary
                   ,bary[1],bary[2],bary[3],
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0xb6d,"ref_node_bary4");
            iVar12 = 0;
            for (lVar10 = 1; lVar10 != 4; lVar10 = lVar10 + 1) {
              iVar1 = (int)lVar10;
              if (bary[iVar12] < bary[lVar10] || bary[iVar12] == bary[lVar10]) {
                iVar1 = iVar12;
              }
              iVar12 = iVar1;
            }
            for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
              bary[lVar10] = 0.0;
            }
            bary[iVar12] = -1.0;
            RVar9 = ref_node_tet_vol(ref_node,nodes,&volume);
            if (RVar9 == 0) {
              printf("vol %.18e modified bary\n%.18e %.18e\n%.18e %.18e\n",volume,*bary,bary[1],
                     bary[2],bary[3]);
              return 4;
            }
            pcVar17 = "bary vol chk";
            uVar13 = 0xb75;
          }
          else {
            pcVar17 = "bary vol chk";
            uVar13 = 0xb6b;
          }
          goto LAB_001c0674;
        }
      }
    }
  }
  pcVar17 = "node invalid";
  RVar9 = 3;
  uVar13 = 0xb2f;
LAB_001c0674:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar13,
         "ref_node_bary4",RVar9,pcVar17);
  return RVar9;
}

Assistant:

REF_FCN REF_STATUS ref_node_bary4(REF_NODE ref_node, REF_INT *nodes,
                                  REF_DBL *xyz, REF_DBL *bary) {
  REF_DBL *a, *b, *c, *d;
  REF_DBL total, m11, m12, m13;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]) ||
      !ref_node_valid(ref_node, nodes[3]))
    RSS(REF_INVALID, "node invalid");

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);
  d = ref_node_xyz_ptr(ref_node, nodes[3]);

  a = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[0] = (m11 - m12 + m13);
  a = ref_node_xyz_ptr(ref_node, nodes[0]);

  b = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[1] = (m11 - m12 + m13);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);

  c = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[2] = (m11 - m12 + m13);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);

  d = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[3] = (m11 - m12 + m13);
  d = ref_node_xyz_ptr(ref_node, nodes[3]);

  total = bary[0] + bary[1] + bary[2] + bary[3];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total) &&
      ref_math_divisible(bary[3], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
    bary[3] /= total;
  } else {
    REF_DBL volume;
    REF_INT i, smallest;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "bary vol chk");
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2],
           bary[3]);
    /* for walking set the smallest as the direction */
    smallest = 0;
    for (i = 1; i < 4; i++)
      if (bary[i] < bary[smallest]) smallest = i;
    for (i = 0; i < 4; i++) bary[i] = 0.0;
    bary[smallest] = -1.0;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "bary vol chk");
    printf("vol %.18e modified bary\n%.18e %.18e\n%.18e %.18e\n", volume,
           bary[0], bary[1], bary[2], bary[3]);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}